

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall test_upscale::vars_abi_cxx11_(string *__return_storage_ptr__,test_upscale *this)

{
  string sStack_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  var_to_str_abi_cxx11_(&local_38,this->type);
  std::operator+(&local_138,"type=",&local_38);
  std::operator+(&local_118,&local_138,",");
  var_to_str<long,4ul>(&local_178,&this->ne);
  std::operator+(&local_158,"ne=",&local_178);
  std::operator+(&local_f8,&local_118,&local_158);
  std::operator+(&local_d8,&local_f8,",");
  var_to_str<int>(&local_1b8,&this->scale_factor);
  std::operator+(&local_198,"scale_factor=",&local_1b8);
  std::operator+(&local_b8,&local_d8,&local_198);
  std::operator+(&local_98,&local_b8,",");
  var_to_str_abi_cxx11_(&local_1f8,this->mode);
  std::operator+(&local_1d8,"mode=",&local_1f8);
  std::operator+(&local_78,&local_98,&local_1d8);
  std::operator+(&local_58,&local_78,",");
  var_to_str<bool>(&sStack_238,&this->transpose);
  std::operator+(&local_218,"transpose=",&sStack_238);
  std::operator+(__return_storage_ptr__,&local_58,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&sStack_238);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR5(type, ne, scale_factor, mode, transpose);
    }